

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction
          (ReplaceInvalidOpcodePass *this,Instruction *inst,char *source,uint32_t line_number,
          uint32_t column_number)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t before;
  string message;
  string local_68;
  spv_position_t local_48;
  
  if (inst->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    if (uVar2 != 0) {
      uVar2 = 0;
      if (inst->has_type_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(inst,0);
      }
      uVar2 = GetSpecialConstant(this,uVar2);
      IRContext::KillNamesAndDecorates((this->super_Pass).context_,inst);
      this_00 = (this->super_Pass).context_;
      before = 0;
      if (inst->has_result_id_ == true) {
        before = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(this_00,before,uVar2);
    }
  }
  bVar1 = spvOpcodeIsBlockTerminator(inst->opcode_);
  if (!bVar1) {
    if ((this->super_Pass).consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
      BuildWarningMessage_abi_cxx11_(&local_68,this,inst->opcode_);
      local_48.line = (size_t)line_number;
      local_48.index = 0;
      local_48.column = (ulong)column_number;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_Pass).consumer_,SPV_MSG_WARNING,source,&local_48,
                   local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    IRContext::KillInst((this->super_Pass).context_,inst);
    return;
  }
  __assert_fail("!inst->IsBlockTerminator() && \"We cannot simply delete a block terminator.  It must be replaced \" \"with something.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                ,0xac,
                "void spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction *, const char *, uint32_t, uint32_t)"
               );
}

Assistant:

void ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction* inst,
                                                  const char* source,
                                                  uint32_t line_number,
                                                  uint32_t column_number) {
  if (inst->result_id() != 0) {
    uint32_t const_id = GetSpecialConstant(inst->type_id());
    context()->KillNamesAndDecorates(inst);
    context()->ReplaceAllUsesWith(inst->result_id(), const_id);
  }
  assert(!inst->IsBlockTerminator() &&
         "We cannot simply delete a block terminator.  It must be replaced "
         "with something.");
  if (consumer()) {
    std::string message = BuildWarningMessage(inst->opcode());
    consumer()(SPV_MSG_WARNING, source, {line_number, column_number, 0},
               message.c_str());
  }
  context()->KillInst(inst);
}